

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O2

void ZSTD_storeSeq(seqStore_t *seqStorePtr,size_t litLength,void *literals,U32 offsetCode,
                  size_t mlBase)

{
  BYTE *pBVar1;
  BYTE *op;
  BYTE *pBVar2;
  seqDef *psVar3;
  
  pBVar2 = seqStorePtr->lit;
  pBVar1 = pBVar2 + litLength;
  do {
    *(undefined8 *)pBVar2 = *literals;
    pBVar2 = pBVar2 + 8;
    literals = (void *)((long)literals + 8);
  } while (pBVar2 < pBVar1);
  seqStorePtr->lit = seqStorePtr->lit + litLength;
  if (litLength < 0x10000) {
    psVar3 = seqStorePtr->sequences;
  }
  else {
    seqStorePtr->longLengthID = 1;
    psVar3 = seqStorePtr->sequences;
    seqStorePtr->longLengthPos =
         (U32)((ulong)((long)psVar3 - (long)seqStorePtr->sequencesStart) >> 3);
  }
  psVar3->litLength = (U16)litLength;
  psVar3->offset = offsetCode + 1;
  if (0xffff < mlBase) {
    seqStorePtr->longLengthID = 2;
    seqStorePtr->longLengthPos =
         (U32)((ulong)((long)psVar3 - (long)seqStorePtr->sequencesStart) >> 3);
  }
  psVar3->matchLength = (U16)mlBase;
  seqStorePtr->sequences = psVar3 + 1;
  return;
}

Assistant:

MEM_STATIC void ZSTD_storeSeq(seqStore_t* seqStorePtr, size_t litLength, const void* literals, U32 offsetCode, size_t mlBase)
{
#if defined(ZSTD_DEBUG) && (ZSTD_DEBUG >= 6)
    static const BYTE* g_start = NULL;
    if (g_start==NULL) g_start = (const BYTE*)literals;  /* note : index only works for compression within a single segment */
    {   U32 const pos = (U32)((const BYTE*)literals - g_start);
        DEBUGLOG(6, "Cpos%7u :%3u literals, match%3u bytes at dist.code%7u",
               pos, (U32)litLength, (U32)mlBase+MINMATCH, (U32)offsetCode);
    }
#endif
    /* copy Literals */
    assert(seqStorePtr->lit + litLength <= seqStorePtr->litStart + 128 KB);
    ZSTD_wildcopy(seqStorePtr->lit, literals, litLength);
    seqStorePtr->lit += litLength;

    /* literal Length */
    if (litLength>0xFFFF) {
        assert(seqStorePtr->longLengthID == 0); /* there can only be a single long length */
        seqStorePtr->longLengthID = 1;
        seqStorePtr->longLengthPos = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    }
    seqStorePtr->sequences[0].litLength = (U16)litLength;

    /* match offset */
    seqStorePtr->sequences[0].offset = offsetCode + 1;

    /* match Length */
    if (mlBase>0xFFFF) {
        assert(seqStorePtr->longLengthID == 0); /* there can only be a single long length */
        seqStorePtr->longLengthID = 2;
        seqStorePtr->longLengthPos = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    }
    seqStorePtr->sequences[0].matchLength = (U16)mlBase;

    seqStorePtr->sequences++;
}